

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu.scanner.c
# Opt level: O3

int yy_get_next_buffer(void)

{
  uint uVar1;
  FILE *__stream;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  int *piVar5;
  size_t sVar6;
  char *pcVar7;
  uint uVar8;
  int iVar9;
  size_t __n;
  long lVar10;
  int iVar11;
  YY_BUFFER_STATE pyVar12;
  YY_BUFFER_STATE *ppyVar13;
  ulong uVar14;
  size_t sVar15;
  
  pcVar3 = yytext;
  pcVar4 = yy_c_buf_p;
  sVar15 = yy_buffer_stack_top;
  ppyVar13 = yy_buffer_stack;
  pyVar12 = yy_buffer_stack[yy_buffer_stack_top];
  pcVar7 = pyVar12->yy_ch_buf;
  if (pcVar7 + (long)yy_n_chars + 1 < yy_c_buf_p) {
    yy_fatal_error("fatal flex scanner internal error--end of buffer missed");
  }
  if (pyVar12->yy_fill_buffer == 0) {
    return ((long)yy_c_buf_p - (long)yytext != 1) + 1;
  }
  uVar8 = ~(uint)yytext + (int)yy_c_buf_p;
  if (0 < (int)uVar8) {
    lVar10 = 0;
    do {
      pcVar7[lVar10] = pcVar3[lVar10];
      lVar10 = lVar10 + 1;
    } while (uVar8 != (uint)lVar10);
    pyVar12 = ppyVar13[sVar15];
  }
  if (pyVar12->yy_buffer_status == 2) {
    yy_n_chars = 0;
LAB_00101f8b:
    pyVar12->yy_n_chars = 0;
  }
  else {
    iVar9 = pyVar12->yy_buf_size;
    while( true ) {
      uVar1 = iVar9 + ~uVar8;
      if (0 < (int)uVar1) break;
      if (pyVar12->yy_is_our_buffer == 0) {
        pyVar12->yy_ch_buf = (char *)0x0;
LAB_0010229d:
        yy_fatal_error("fatal error - scanner input buffer overflow");
      }
      iVar2 = iVar9 - ((uint)-iVar9 >> 3);
      if (0 < iVar9) {
        iVar2 = iVar9 * 2;
      }
      pcVar7 = pyVar12->yy_ch_buf;
      pyVar12->yy_buf_size = iVar2;
      pcVar3 = (char *)realloc(pcVar7,(long)(iVar2 + 2));
      pyVar12->yy_ch_buf = pcVar3;
      if (pcVar3 == (char *)0x0) goto LAB_0010229d;
      pcVar4 = pcVar3 + ((int)pcVar4 - (int)pcVar7);
      pyVar12 = ppyVar13[sVar15];
      iVar9 = pyVar12->yy_buf_size;
      yy_c_buf_p = pcVar4;
    }
    __n = 0x2000;
    if (uVar1 < 0x2000) {
      __n = (ulong)uVar1;
    }
    if (pyVar12->yy_is_interactive == 0) {
      piVar5 = __errno_location();
      *piVar5 = 0;
      while( true ) {
        sVar6 = fread(yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf + (int)uVar8,1,__n,
                      (FILE *)yyin);
        sVar15 = yy_buffer_stack_top;
        ppyVar13 = yy_buffer_stack;
        __stream = yyin;
        iVar9 = (int)sVar6;
        yy_n_chars = iVar9;
        if (iVar9 != 0) break;
        iVar9 = ferror((FILE *)yyin);
        if (iVar9 == 0) {
          pyVar12 = yy_buffer_stack[yy_buffer_stack_top];
          ppyVar13 = yy_buffer_stack;
          sVar15 = yy_buffer_stack_top;
          goto LAB_00101f8b;
        }
        if (*piVar5 != 4) goto LAB_001022b5;
        *piVar5 = 0;
        clearerr((FILE *)__stream);
      }
      pyVar12 = yy_buffer_stack[yy_buffer_stack_top];
      pyVar12->yy_n_chars = iVar9;
      iVar2 = 0;
      goto LAB_001021ff;
    }
    uVar14 = 0;
    do {
      iVar2 = getc((FILE *)yyin);
      if ((iVar2 == -1) || (iVar2 == 10)) {
        __n = uVar14 & 0xffffffff;
        break;
      }
      yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf[uVar14 + (long)(int)uVar8] = (char)iVar2;
      uVar14 = uVar14 + 1;
    } while (__n != uVar14);
    iVar9 = (int)__n;
    if (iVar2 == -1) {
      iVar2 = ferror((FILE *)yyin);
      if (iVar2 != 0) {
LAB_001022b5:
        yy_fatal_error("input in flex scanner failed");
      }
    }
    else if (iVar2 == 10) {
      iVar9 = iVar9 + 1;
      yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf[__n + (long)(int)uVar8] = '\n';
      sVar15 = yy_buffer_stack_top;
      ppyVar13 = yy_buffer_stack;
      pyVar12 = yy_buffer_stack[yy_buffer_stack_top];
      yy_n_chars = iVar9;
      pyVar12->yy_n_chars = iVar9;
      iVar2 = 0;
      goto LAB_001021ff;
    }
    sVar15 = yy_buffer_stack_top;
    ppyVar13 = yy_buffer_stack;
    pyVar12 = yy_buffer_stack[yy_buffer_stack_top];
    yy_n_chars = iVar9;
    pyVar12->yy_n_chars = iVar9;
    iVar2 = 0;
    if (iVar9 != 0) goto LAB_001021ff;
  }
  if (uVar8 == 0) {
    yyrestart(yyin);
    pyVar12 = yy_buffer_stack[yy_buffer_stack_top];
    iVar2 = 1;
    ppyVar13 = yy_buffer_stack;
    sVar15 = yy_buffer_stack_top;
    iVar9 = yy_n_chars;
  }
  else {
    pyVar12->yy_buffer_status = 2;
    iVar2 = 2;
    iVar9 = 0;
  }
LAB_001021ff:
  iVar11 = iVar9 + uVar8;
  if (pyVar12->yy_buf_size < iVar11) {
    iVar9 = (iVar9 >> 1) + iVar11;
    pcVar7 = (char *)realloc(pyVar12->yy_ch_buf,(long)iVar9);
    ppyVar13[sVar15]->yy_ch_buf = pcVar7;
    pcVar7 = ppyVar13[sVar15]->yy_ch_buf;
    if (pcVar7 == (char *)0x0) {
      yy_fatal_error("out of dynamic memory in yy_get_next_buffer()");
    }
    ppyVar13[sVar15]->yy_buf_size = iVar9 + -2;
  }
  else {
    pcVar7 = pyVar12->yy_ch_buf;
  }
  yy_n_chars = iVar11;
  pcVar7[iVar11] = '\0';
  ppyVar13[sVar15]->yy_ch_buf[(long)iVar11 + 1] = '\0';
  yytext = ppyVar13[sVar15]->yy_ch_buf;
  return iVar2;
}

Assistant:

static int yy_get_next_buffer (void)
{
    	char *dest = YY_CURRENT_BUFFER_LVALUE->yy_ch_buf;
	char *source = (yytext_ptr);
	int number_to_move, i;
	int ret_val;

	if ( (yy_c_buf_p) > &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars) + 1] )
		YY_FATAL_ERROR(
		"fatal flex scanner internal error--end of buffer missed" );

	if ( YY_CURRENT_BUFFER_LVALUE->yy_fill_buffer == 0 )
		{ /* Don't try to fill the buffer, so this is an EOF. */
		if ( (yy_c_buf_p) - (yytext_ptr) - YY_MORE_ADJ == 1 )
			{
			/* We matched a single character, the EOB, so
			 * treat this as a final EOF.
			 */
			return EOB_ACT_END_OF_FILE;
			}

		else
			{
			/* We matched some text prior to the EOB, first
			 * process it.
			 */
			return EOB_ACT_LAST_MATCH;
			}
		}

	/* Try to read more data. */

	/* First move last chars to start of buffer. */
	number_to_move = (int) ((yy_c_buf_p) - (yytext_ptr) - 1);

	for ( i = 0; i < number_to_move; ++i )
		*(dest++) = *(source++);

	if ( YY_CURRENT_BUFFER_LVALUE->yy_buffer_status == YY_BUFFER_EOF_PENDING )
		/* don't do the read, it's not guaranteed to return an EOF,
		 * just force an EOF
		 */
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = (yy_n_chars) = 0;

	else
		{
			int num_to_read =
			YY_CURRENT_BUFFER_LVALUE->yy_buf_size - number_to_move - 1;

		while ( num_to_read <= 0 )
			{ /* Not enough room in the buffer - grow it. */

			/* just a shorter name for the current buffer */
			YY_BUFFER_STATE b = YY_CURRENT_BUFFER_LVALUE;

			int yy_c_buf_p_offset =
				(int) ((yy_c_buf_p) - b->yy_ch_buf);

			if ( b->yy_is_our_buffer )
				{
				int new_size = b->yy_buf_size * 2;

				if ( new_size <= 0 )
					b->yy_buf_size += b->yy_buf_size / 8;
				else
					b->yy_buf_size *= 2;

				b->yy_ch_buf = (char *)
					/* Include room in for 2 EOB chars. */
					yyrealloc( (void *) b->yy_ch_buf,
							 (yy_size_t) (b->yy_buf_size + 2)  );
				}
			else
				/* Can't grow it, we don't own it. */
				b->yy_ch_buf = NULL;

			if ( ! b->yy_ch_buf )
				YY_FATAL_ERROR(
				"fatal error - scanner input buffer overflow" );

			(yy_c_buf_p) = &b->yy_ch_buf[yy_c_buf_p_offset];

			num_to_read = YY_CURRENT_BUFFER_LVALUE->yy_buf_size -
						number_to_move - 1;

			}

		if ( num_to_read > YY_READ_BUF_SIZE )
			num_to_read = YY_READ_BUF_SIZE;

		/* Read in more data. */
		YY_INPUT( (&YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[number_to_move]),
			(yy_n_chars), num_to_read );

		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = (yy_n_chars);
		}

	if ( (yy_n_chars) == 0 )
		{
		if ( number_to_move == YY_MORE_ADJ )
			{
			ret_val = EOB_ACT_END_OF_FILE;
			yyrestart( yyin  );
			}

		else
			{
			ret_val = EOB_ACT_LAST_MATCH;
			YY_CURRENT_BUFFER_LVALUE->yy_buffer_status =
				YY_BUFFER_EOF_PENDING;
			}
		}

	else
		ret_val = EOB_ACT_CONTINUE_SCAN;

	if (((yy_n_chars) + number_to_move) > YY_CURRENT_BUFFER_LVALUE->yy_buf_size) {
		/* Extend the array by 50%, plus the number we really need. */
		int new_size = (yy_n_chars) + number_to_move + ((yy_n_chars) >> 1);
		YY_CURRENT_BUFFER_LVALUE->yy_ch_buf = (char *) yyrealloc(
			(void *) YY_CURRENT_BUFFER_LVALUE->yy_ch_buf, (yy_size_t) new_size  );
		if ( ! YY_CURRENT_BUFFER_LVALUE->yy_ch_buf )
			YY_FATAL_ERROR( "out of dynamic memory in yy_get_next_buffer()" );
		/* "- 2" to take care of EOB's */
		YY_CURRENT_BUFFER_LVALUE->yy_buf_size = (int) (new_size - 2);
	}

	(yy_n_chars) += number_to_move;
	YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars)] = YY_END_OF_BUFFER_CHAR;
	YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars) + 1] = YY_END_OF_BUFFER_CHAR;

	(yytext_ptr) = &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[0];

	return ret_val;
}